

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

float ImGui::ScaleRatioFromValueT<float,float,float>
                (ImGuiDataType data_type,float v,float v_min,float v_max,bool is_logarithmic,
                float logarithmic_zero_epsilon,float zero_deadzone_halfsize)

{
  undefined1 auVar1 [16];
  bool bVar2;
  byte in_SIL;
  float in_XMM0_Da;
  float fVar3;
  float fVar4;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  float in_XMM4_Da;
  float zero_point_snap_R;
  float zero_point_snap_L;
  float zero_point_center;
  float result;
  float v_max_fudged;
  float v_min_fudged;
  bool flipped;
  float v_clamped;
  float local_6c;
  float local_54;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  float local_34;
  float local_30;
  float local_2c;
  float local_14;
  float local_10;
  float local_c;
  float local_4;
  
  if ((in_XMM1_Da != in_XMM2_Da) || (NAN(in_XMM1_Da) || NAN(in_XMM2_Da))) {
    local_14 = in_XMM2_Da;
    local_10 = in_XMM1_Da;
    local_c = in_XMM0_Da;
    if (in_XMM2_Da <= in_XMM1_Da) {
      local_44 = ImClamp<float>(in_XMM0_Da,in_XMM2_Da,in_XMM1_Da);
    }
    else {
      local_44 = ImClamp<float>(in_XMM0_Da,in_XMM1_Da,in_XMM2_Da);
    }
    if ((in_SIL & 1) == 0) {
      local_4 = (local_44 - local_10) / (local_14 - local_10);
    }
    else {
      bVar2 = local_14 < local_10;
      if (bVar2) {
        ImSwap<float>(&local_10,&local_14);
      }
      fVar3 = ImAbs(local_10);
      if (in_XMM3_Da <= fVar3) {
        local_4c = local_10;
      }
      else {
        local_48 = in_XMM3_Da;
        if (local_10 < 0.0) {
          local_48 = -in_XMM3_Da;
        }
        local_4c = local_48;
      }
      local_2c = local_4c;
      fVar3 = ImAbs(local_14);
      if (in_XMM3_Da <= fVar3) {
        local_54 = local_14;
      }
      else {
        local_50 = in_XMM3_Da;
        if (local_14 < 0.0) {
          local_50 = -in_XMM3_Da;
        }
        local_54 = local_50;
      }
      local_30 = local_54;
      if (((local_10 != 0.0) || (NAN(local_10))) || (0.0 <= local_14)) {
        if (((local_14 == 0.0) && (!NAN(local_14))) && (local_10 < 0.0)) {
          local_30 = -in_XMM3_Da;
        }
      }
      else {
        local_2c = -in_XMM3_Da;
      }
      if (local_2c < local_44) {
        if (local_44 < local_30) {
          if (0.0 <= local_10 * local_14) {
            if ((local_10 < 0.0) || (local_14 < 0.0)) {
              fVar3 = ImLog(0.0);
              fVar4 = ImLog(0.0);
              local_34 = 1.0 - fVar3 / fVar4;
            }
            else {
              local_34 = ImLog(0.0);
              fVar3 = ImLog(0.0);
              local_34 = local_34 / fVar3;
            }
          }
          else {
            local_34 = -local_10 / (local_14 - local_10);
            if ((local_c != 0.0) || (NAN(local_c))) {
              if (0.0 <= local_c) {
                fVar3 = ImLog(0.0);
                fVar4 = ImLog(0.0);
                auVar1 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - (local_34 + in_XMM4_Da))),
                                         ZEXT416((uint)(fVar3 / fVar4)),
                                         ZEXT416((uint)(local_34 + in_XMM4_Da)));
                local_34 = auVar1._0_4_;
              }
              else {
                fVar3 = ImLog(0.0);
                fVar4 = ImLog(0.0);
                local_34 = (1.0 - fVar3 / fVar4) * (local_34 - in_XMM4_Da);
              }
            }
          }
        }
        else {
          local_34 = 1.0;
        }
      }
      else {
        local_34 = 0.0;
      }
      if (bVar2) {
        local_6c = 1.0 - local_34;
      }
      else {
        local_6c = local_34;
      }
      local_4 = local_6c;
    }
  }
  else {
    local_4 = 0.0;
  }
  return local_4;
}

Assistant:

float ImGui::ScaleRatioFromValueT(ImGuiDataType data_type, TYPE v, TYPE v_min, TYPE v_max, bool is_logarithmic, float logarithmic_zero_epsilon, float zero_deadzone_halfsize)
{
    if (v_min == v_max)
        return 0.0f;
    IM_UNUSED(data_type);

    const TYPE v_clamped = (v_min < v_max) ? ImClamp(v, v_min, v_max) : ImClamp(v, v_max, v_min);
    if (is_logarithmic)
    {
        bool flipped = v_max < v_min;

        if (flipped) // Handle the case where the range is backwards
            ImSwap(v_min, v_max);

        // Fudge min/max to avoid getting close to log(0)
        FLOATTYPE v_min_fudged = (ImAbs((FLOATTYPE)v_min) < logarithmic_zero_epsilon) ? ((v_min < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_min;
        FLOATTYPE v_max_fudged = (ImAbs((FLOATTYPE)v_max) < logarithmic_zero_epsilon) ? ((v_max < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_max;

        // Awkward special cases - we need ranges of the form (-100 .. 0) to convert to (-100 .. -epsilon), not (-100 .. epsilon)
        if ((v_min == 0.0f) && (v_max < 0.0f))
            v_min_fudged = -logarithmic_zero_epsilon;
        else if ((v_max == 0.0f) && (v_min < 0.0f))
            v_max_fudged = -logarithmic_zero_epsilon;

        float result;

        if (v_clamped <= v_min_fudged)
            result = 0.0f; // Workaround for values that are in-range but below our fudge
        else if (v_clamped >= v_max_fudged)
            result = 1.0f; // Workaround for values that are in-range but above our fudge
        else if ((v_min * v_max) < 0.0f) // Range crosses zero, so split into two portions
        {
            float zero_point_center = (-(float)v_min) / ((float)v_max - (float)v_min); // The zero point in parametric space.  There's an argument we should take the logarithmic nature into account when calculating this, but for now this should do (and the most common case of a symmetrical range works fine)
            float zero_point_snap_L = zero_point_center - zero_deadzone_halfsize;
            float zero_point_snap_R = zero_point_center + zero_deadzone_halfsize;
            if (v == 0.0f)
                result = zero_point_center; // Special case for exactly zero
            else if (v < 0.0f)
                result = (1.0f - (float)(ImLog(-(FLOATTYPE)v_clamped / logarithmic_zero_epsilon) / ImLog(-v_min_fudged / logarithmic_zero_epsilon))) * zero_point_snap_L;
            else
                result = zero_point_snap_R + ((float)(ImLog((FLOATTYPE)v_clamped / logarithmic_zero_epsilon) / ImLog(v_max_fudged / logarithmic_zero_epsilon)) * (1.0f - zero_point_snap_R));
        }
        else if ((v_min < 0.0f) || (v_max < 0.0f)) // Entirely negative slider
            result = 1.0f - (float)(ImLog(-(FLOATTYPE)v_clamped / -v_max_fudged) / ImLog(-v_min_fudged / -v_max_fudged));
        else
            result = (float)(ImLog((FLOATTYPE)v_clamped / v_min_fudged) / ImLog(v_max_fudged / v_min_fudged));

        return flipped ? (1.0f - result) : result;
    }

    // Linear slider
    return (float)((FLOATTYPE)(SIGNEDTYPE)(v_clamped - v_min) / (FLOATTYPE)(SIGNEDTYPE)(v_max - v_min));
}